

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve::~Ifc2DCompositeCurve(Ifc2DCompositeCurve *this)

{
  void *pvVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcCompositeCurve.super_IfcBoundedCurve.super_IfcCurve.
    super_IfcGeometricRepresentationItem.field_0x28 = 0x8aba68;
  *(undefined8 *)
   &(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x8abb30;
  *(undefined8 *)&this[-1].super_IfcCompositeCurve.super_IfcBoundedCurve.super_IfcCurve.field_0x38 =
       0x8aba90;
  *(undefined8 *)&this[-1].super_IfcCompositeCurve.super_IfcBoundedCurve.field_0x48 = 0x8abab8;
  *(undefined8 *)&this[-1].super_IfcCompositeCurve.field_0x58 = 0x8abae0;
  this[-1].super_IfcCompositeCurve.SelfIntersect.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x8abb08;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[-1].field_0x98 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[-1].field_0x98);
  }
  pvVar1 = *(void **)&this[-1].super_IfcCompositeCurve.field_0x78;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
    return;
  }
  return;
}

Assistant:

Ifc2DCompositeCurve() : Object("Ifc2DCompositeCurve") {}